

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::SCCAnalyzer(SCCAnalyzer *this,Options *options)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar2 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + (options->dllexport_decl)._M_string_length);
  bVar3 = options->table_driven_parsing;
  (this->options_).enforce_lite = options->enforce_lite;
  (this->options_).table_driven_parsing = bVar3;
  bVar3 = options->proto_h;
  bVar4 = options->transitive_pb_h;
  bVar5 = options->annotate_headers;
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  (this->options_).proto_h = bVar3;
  (this->options_).transitive_pb_h = bVar4;
  (this->options_).annotate_headers = bVar5;
  (this->options_).annotation_pragma_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_pragma_name.field_2;
  pcVar2 = (options->annotation_pragma_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_pragma_name,pcVar2,
             pcVar2 + (options->annotation_pragma_name)._M_string_length);
  (this->options_).annotation_guard_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_guard_name.field_2;
  pcVar2 = (options->annotation_guard_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_guard_name,pcVar2,
             pcVar2 + (options->annotation_guard_name)._M_string_length);
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->garbage_bin_).
  super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->garbage_bin_).
  super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->garbage_bin_).
  super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stack_).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack_).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index_ = 0;
  return;
}

Assistant:

~SCCAnalyzer() {
    for (int i = 0; i < garbage_bin_.size(); i++) delete garbage_bin_[i];
  }